

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_string_createWithoutSuffix(sysbvm_context_t *context,sysbvm_tuple_t string,char *suffix)

{
  int iVar1;
  size_t __n;
  ulong uVar2;
  void *__src;
  
  __n = strlen(suffix);
  if (__n != 0) {
    if ((string & 0xf) == 0 && string != 0) {
      uVar2 = (ulong)*(uint *)(string + 0xc);
    }
    else {
      uVar2 = 0;
    }
    if (__n <= uVar2) {
      iVar1 = bcmp((void *)((string + uVar2 + 0x10) - __n),suffix,__n);
      if (iVar1 == 0) {
        __src = (void *)(string + 0x10);
        string = sysbvm_string_createEmptyWithSize(context,uVar2 - __n);
        memcpy((void *)(string + 0x10),__src,uVar2 - __n);
      }
    }
  }
  return string;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_string_createWithoutSuffix(sysbvm_context_t *context, sysbvm_tuple_t string, const char *suffix)
{
    size_t suffixLen = strlen(suffix);
    if(suffixLen == 0)
        return string;

    size_t stringSize = sysbvm_tuple_getSizeInBytes(string);
    if(stringSize < suffixLen)
        return string;

    uint8_t *stringData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes;
    if(memcmp(stringData + stringSize - suffixLen, suffix, suffixLen))
        return string;

    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, stringSize - suffixLen);
    uint8_t *resultData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes;
    memcpy(resultData, stringData, stringSize - suffixLen);
    return result;
}